

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O3

void __thiscall DBot::Set_enemy(DBot *this)

{
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  
  pAVar2 = (this->enemy).field_0.p;
  if (pAVar2 == (AActor *)0x0) {
LAB_0049f852:
    pAVar3 = (AActor *)0x0;
  }
  else {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
LAB_0049f84a:
      (this->enemy).field_0.p = (AActor *)0x0;
      goto LAB_0049f852;
    }
    if (pAVar2->health < 1) goto LAB_0049f852;
    pAVar3 = (AActor *)0x0;
    bVar1 = P_CheckSight(&this->player->mo->super_AActor,pAVar2,0);
    if (bVar1) {
      pAVar3 = (this->enemy).field_0.p;
      if (pAVar3 == (AActor *)0x0) goto LAB_0049f852;
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_0049f84a;
    }
  }
  pAVar2 = (this->enemy).field_0.p;
  if (deathmatch.Value == 0) {
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049f8b3;
LAB_0049f880:
      (this->enemy).field_0.p = (AActor *)0x0;
    }
LAB_0049f888:
    bVar1 = false;
  }
  else {
    if (pAVar2 == (AActor *)0x0) goto LAB_0049f888;
    bVar1 = true;
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_0049f880;
  }
  this->allround = bVar1;
  pAVar2 = Find_enemy(this);
  (this->enemy).field_0.p = pAVar2;
  if (((pAVar2 == (AActor *)0x0) ||
      (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) &&
     ((this->enemy).field_0.p = pAVar3, pAVar2 = pAVar3, pAVar3 == (AActor *)0x0)) {
    return;
  }
LAB_0049f8b3:
  if (((((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) || (pAVar2->health < 0))
     || ((((pAVar2->flags).Value & 4) == 0 ||
         (bVar1 = AActor::IsFriend(&this->player->mo->super_AActor,pAVar2), bVar1)))) {
    (this->enemy).field_0.p = (AActor *)0x0;
  }
  return;
}

Assistant:

void DBot::Set_enemy ()
{
	AActor *oldenemy;

	if (enemy
		&& enemy->health > 0
		&& P_CheckSight (player->mo, enemy))
	{
		oldenemy = enemy;
	}
	else
	{
		oldenemy = NULL;
	}

	// [RH] Don't even bother looking for a different enemy if this is not deathmatch
	// and we already have an existing enemy.
	if (deathmatch || !enemy)
	{
		allround = !!enemy;
		enemy = Find_enemy();
		if (!enemy)
			enemy = oldenemy; //Try go for last (it will be NULL if there wasn't anyone)
	}
	//Verify that that enemy is really something alive that bot can kill.
	if (enemy && ((enemy->health < 0 || !(enemy->flags&MF_SHOOTABLE)) || player->mo->IsFriend(enemy)))
		enemy = NULL;
}